

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-as.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  mapped_type *pmVar3;
  string *psVar4;
  ostream *poVar5;
  long lVar6;
  allocator<char> local_10f1;
  key_type local_10f0;
  string local_10d0 [32];
  string local_10b0;
  string local_1090;
  string local_1070;
  undefined1 local_1050 [8];
  ModuleWriter writer;
  allocator<char> local_e49;
  key_type local_e48;
  undefined1 local_e22 [2];
  key_type local_e20;
  Fatal local_e00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c78;
  Err *err;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c68;
  undefined1 local_c40 [16];
  Result<wasm::Ok> local_c30 [8];
  Result<wasm::Ok> parsed;
  undefined1 local_c08 [8];
  Module wasm;
  key_type local_810;
  string local_7f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  key_type local_7c8;
  allocator<char> local_7a1;
  string local_7a0;
  allocator<char> local_779;
  key_type local_778;
  string local_758;
  string local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  _Self local_6f8;
  allocator<char> local_6e9;
  key_type local_6e8;
  _Self local_6c8;
  anon_class_1_0_00000001 local_6b9;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_6b8;
  allocator<char> local_691;
  string local_690 [32];
  anon_class_8_1_fd553744 local_670;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_668;
  allocator<char> local_641;
  string local_640 [39];
  allocator<char> local_619;
  string local_618 [39];
  allocator<char> local_5f1;
  string local_5f0 [32];
  anon_class_8_1_64674c6c local_5d0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_5c8;
  allocator<char> local_5a1;
  string local_5a0 [39];
  allocator<char> local_579;
  string local_578 [39];
  allocator<char> local_551;
  string local_550 [32];
  anon_class_8_1_8b266608 local_530;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_528;
  allocator<char> local_501;
  string local_500 [39];
  allocator<char> local_4d9;
  string local_4d8 [39];
  allocator<char> local_4b1;
  string local_4b0 [32];
  anon_class_8_1_09c29441 local_490;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_488;
  allocator<char> local_461;
  string local_460 [39];
  allocator<char> local_439;
  string local_438 [39];
  allocator<char> local_411;
  string local_410 [39];
  anon_class_1_0_00000001 local_3e9;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_3e8;
  allocator<char> local_3c1;
  string local_3c0 [39];
  allocator<char> local_399;
  string local_398 [39];
  allocator<char> local_371;
  string local_370 [39];
  anon_class_1_0_00000001 local_349;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_348;
  allocator<char> local_321;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0 [39];
  allocator<char> local_2a9;
  key_type local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  undefined1 local_238 [8];
  ToolOptions options;
  allocator<char> local_a1;
  string local_a0 [8];
  string WasmAsOption;
  string sourceMapUrl;
  string sourceMapFilename;
  string symbolMap;
  bool debugInfo;
  char **argv_local;
  int argc_local;
  
  symbolMap.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)(sourceMapFilename.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sourceMapUrl.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(WasmAsOption.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"wasm-as options",&local_a1);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"wasm-as",&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,
             "Assemble a .wat (WebAssembly text format) into a .wasm (WebAssembly binary format)",
             &local_281);
  ::wasm::ToolOptions::ToolOptions((ToolOptions *)local_238,&local_258,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"validate",&local_2a9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options.super_Options,&local_2a8);
  std::__cxx11::string::operator=((string *)pmVar3,"wasm");
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"--output",&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"-o",&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"Output file",&local_321);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_348,&local_349);
  psVar4 = (string *)
           ::wasm::Options::add
                     ((string *)&options,local_2d0,local_2f8,local_320,(Arguments)local_a0,
                      (function *)0x1,SUB81(&local_348,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_370,"--validate",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_398,"-v",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c0,"Control validation of the output module",&local_3c1);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__1,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_3e8,&local_3e9);
  psVar4 = (string *)
           ::wasm::Options::add
                     (psVar4,local_370,local_398,local_3c0,(Arguments)local_a0,(function *)0x1,
                      SUB81(&local_3e8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_410,"--debuginfo",&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_438,"-g",&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_460,"Emit names section and debug info",&local_461);
  local_490.debugInfo = (bool *)((long)&symbolMap.field_2 + 0xf);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__2,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_488,&local_490);
  psVar4 = (string *)
           ::wasm::Options::add
                     (psVar4,local_410,local_438,local_460,(Arguments)local_a0,(function *)0x0,
                      SUB81(&local_488,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4b0,"--source-map",&local_4b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d8,"-sm",&local_4d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_500,"Emit source map to the specified file",&local_501);
  local_530.sourceMapFilename = (string *)((long)&sourceMapUrl.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__3,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_528,&local_530);
  psVar4 = (string *)
           ::wasm::Options::add
                     (psVar4,local_4b0,local_4d8,local_500,(Arguments)local_a0,(function *)0x1,
                      SUB81(&local_528,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_550,"--source-map-url",&local_551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_578,"-su",&local_579);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5a0,"Use specified string as source map URL",&local_5a1);
  local_5d0.sourceMapUrl = (string *)((long)&WasmAsOption.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__4,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_5c8,&local_5d0);
  psVar4 = (string *)
           ::wasm::Options::add
                     (psVar4,local_550,local_578,local_5a0,(Arguments)local_a0,(function *)0x1,
                      SUB81(&local_5c8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5f0,"--symbolmap",&local_5f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_618,"-s",&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_640,"Emit a symbol map (indexes => names)",&local_641);
  local_670.symbolMap = (string *)((long)&sourceMapFilename.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__5,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_668,&local_670);
  psVar4 = (string *)
           ::wasm::Options::add
                     (psVar4,local_5f0,local_618,local_640,(Arguments)local_a0,(function *)0x1,
                      SUB81(&local_668,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_690,"INFILE",&local_691);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__6,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_6b8,&local_6b9);
  ::wasm::Options::add_positional(psVar4,(Arguments)local_690,(function *)0x1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_6b8);
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator(&local_691);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_668);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator(&local_641);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator(&local_619);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_5c8);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator(&local_579);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator(&local_551);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_528);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_488);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator(&local_439);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator(&local_411);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_3e8);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_348);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  ::wasm::Options::parse((int)&options,(char **)(ulong)(uint)argc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"output",&local_6e9);
  local_6c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&options.super_Options,&local_6e8);
  local_6f8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&options.super_Options);
  bVar1 = std::operator==(&local_6c8,&local_6f8);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator(&local_6e9);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"infile",&local_779);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&options.super_Options,&local_778);
    std::__cxx11::string::string((string *)&local_758,(string *)pmVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a0,".wat",&local_7a1);
    ::wasm::removeSpecificSuffix(&local_738,&local_758,&local_7a0);
    std::operator+(&local_718,&local_738,".wasm");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7c8,"output",(allocator<char> *)(input.field_2._M_local_buf + 0xf));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&options.super_Options,&local_7c8);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_718);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::allocator<char>::~allocator((allocator<char> *)(input.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_718);
    std::__cxx11::string::~string((string *)&local_738);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::allocator<char>::~allocator(&local_7a1);
    std::__cxx11::string::~string((string *)&local_758);
    std::__cxx11::string::~string((string *)&local_778);
    std::allocator<char>::~allocator(&local_779);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_810,"infile",
             (allocator<char> *)((long)&wasm.tagsMap._M_h._M_single_bucket + 7));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options.super_Options,&local_810);
  ::wasm::read_file<std::__cxx11::string>(local_7f0,(BinaryOption)pmVar3);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&wasm.tagsMap._M_h._M_single_bucket + 7));
  ::wasm::Module::Module((Module *)local_c08);
  ::wasm::ToolOptions::applyOptionsBeforeParse((ToolOptions *)local_238,(Module *)local_c08);
  local_c40 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::parseModule(local_c30,local_c08,local_c40._0_8_,local_c40._8_8_,&local_c68);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_c68);
  local_c78 = &::wasm::Result<wasm::Ok>::getErr(local_c30)->msg;
  if (local_c78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::wasm::Fatal::Fatal(&local_e00);
    ::wasm::Fatal::operator<<(&local_e00,local_c78);
    ::wasm::Fatal::~Fatal(&local_e00);
  }
  ::wasm::ToolOptions::applyOptionsAfterParse((ToolOptions *)local_238,(Module *)local_c08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e20,"validate",(allocator<char> *)(local_e22 + 1));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options.super_Options,&local_e20);
  bVar1 = std::operator!=(pmVar3,"none");
  std::__cxx11::string::~string((string *)&local_e20);
  std::allocator<char>::~allocator((allocator<char> *)(local_e22 + 1));
  if (bVar1) {
    if (((byte)options._vptr_ToolOptions & 1) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Validating...");
      std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e48,"validate",&local_e49);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&options.super_Options,&local_e48);
    std::operator==(pmVar3,"web");
    bVar2 = ::wasm::WasmValidator::validate((Module *)local_e22,(uint)local_c08);
    std::__cxx11::string::~string((string *)&local_e48);
    std::allocator<char>::~allocator(&local_e49);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      ::wasm::Fatal::Fatal((Fatal *)((long)&writer.sourceMapUrl.field_2 + 8));
      ::wasm::Fatal::operator<<
                ((Fatal *)((long)&writer.sourceMapUrl.field_2 + 8),
                 (char (*) [35])"Error: input module is not valid.\n");
      ::wasm::Fatal::~Fatal((Fatal *)((long)&writer.sourceMapUrl.field_2 + 8));
    }
  }
  if (((byte)options._vptr_ToolOptions & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"writing...");
    std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  }
  ::wasm::ModuleWriter::ModuleWriter((ModuleWriter *)local_1050,(PassOptions *)&options.field_0xb0);
  ::wasm::ModuleWriter::setBinary((ModuleWriter *)local_1050,true);
  ::wasm::ModuleIOBase::setDebugInfo
            ((ModuleIOBase *)local_1050,(bool)(symbolMap.field_2._M_local_buf[0xf] & 1));
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    std::__cxx11::string::string
              ((string *)&local_1070,(string *)(sourceMapUrl.field_2._M_local_buf + 8));
    ::wasm::ModuleWriter::setSourceMapFilename((ModuleWriter *)local_1050,&local_1070);
    std::__cxx11::string::~string((string *)&local_1070);
    std::__cxx11::string::string
              ((string *)&local_1090,(string *)(WasmAsOption.field_2._M_local_buf + 8));
    ::wasm::ModuleWriter::setSourceMapUrl((ModuleWriter *)local_1050,&local_1090);
    std::__cxx11::string::~string((string *)&local_1090);
  }
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    std::__cxx11::string::string
              ((string *)&local_10b0,(string *)(sourceMapFilename.field_2._M_local_buf + 8));
    ::wasm::ModuleWriter::setSymbolMap((ModuleWriter *)local_1050,&local_10b0);
    std::__cxx11::string::~string((string *)&local_10b0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10f0,"output",&local_10f1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options.super_Options,&local_10f0);
  std::__cxx11::string::string(local_10d0,(string *)pmVar3);
  ::wasm::ModuleWriter::write(local_1050,local_c08,local_10d0);
  std::__cxx11::string::~string(local_10d0);
  std::__cxx11::string::~string((string *)&local_10f0);
  std::allocator<char>::~allocator(&local_10f1);
  if (((byte)options._vptr_ToolOptions & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Done.");
    std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  }
  ::wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)local_1050);
  ::wasm::Result<wasm::Ok>::~Result(local_c30);
  ::wasm::Module::~Module((Module *)local_c08);
  std::__cxx11::string::~string(local_7f0);
  ::wasm::ToolOptions::~ToolOptions((ToolOptions *)local_238);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)(WasmAsOption.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sourceMapUrl.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sourceMapFilename.field_2._M_local_buf + 8));
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  bool debugInfo = false;
  std::string symbolMap;
  std::string sourceMapFilename;
  std::string sourceMapUrl;

  const std::string WasmAsOption = "wasm-as options";

  ToolOptions options("wasm-as",
                      "Assemble a .wat (WebAssembly text format) into a .wasm "
                      "(WebAssembly binary format)");
  options.extra["validate"] = "wasm";
  options
    .add("--output",
         "-o",
         "Output file",
         WasmAsOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add("--validate",
         "-v",
         "Control validation of the output module",
         WasmAsOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           if (argument != "web" && argument != "none" && argument != "wasm") {
             Fatal() << "Valid arguments for --validate flag are 'wasm', "
                        "'web', and 'none'.\n";
           }
           o->extra["validate"] = argument;
         })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmAsOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; })
    .add("--source-map",
         "-sm",
         "Emit source map to the specified file",
         WasmAsOption,
         Options::Arguments::One,
         [&sourceMapFilename](Options* o, const std::string& argument) {
           sourceMapFilename = argument;
         })
    .add("--source-map-url",
         "-su",
         "Use specified string as source map URL",
         WasmAsOption,
         Options::Arguments::One,
         [&sourceMapUrl](Options* o, const std::string& argument) {
           sourceMapUrl = argument;
         })
    .add("--symbolmap",
         "-s",
         "Emit a symbol map (indexes => names)",
         WasmAsOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { symbolMap = argument; })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  // default output is infile with changed suffix
  if (options.extra.find("output") == options.extra.end()) {
    options.extra["output"] =
      removeSpecificSuffix(options.extra["infile"], ".wat") + ".wasm";
  }

  auto input(read_file<std::string>(options.extra["infile"], Flags::Text));

  Module wasm;
  options.applyOptionsBeforeParse(wasm);

  auto parsed = WATParser::parseModule(wasm, input);
  if (auto* err = parsed.getErr()) {
    Fatal() << err->msg;
  }

  options.applyOptionsAfterParse(wasm);

  if (options.extra["validate"] != "none") {
    if (options.debug) {
      std::cerr << "Validating..." << std::endl;
    }
    if (!wasm::WasmValidator().validate(
          wasm,
          WasmValidator::Globally |
            (options.extra["validate"] == "web" ? WasmValidator::Web : 0))) {
      Fatal() << "Error: input module is not valid.\n";
    }
  }

  if (options.debug) {
    std::cerr << "writing..." << std::endl;
  }
  ModuleWriter writer(options.passOptions);
  writer.setBinary(true);
  writer.setDebugInfo(debugInfo);
  if (sourceMapFilename.size()) {
    writer.setSourceMapFilename(sourceMapFilename);
    writer.setSourceMapUrl(sourceMapUrl);
  }
  if (symbolMap.size() > 0) {
    writer.setSymbolMap(symbolMap);
  }
  writer.write(wasm, options.extra["output"]);

  if (options.debug) {
    std::cerr << "Done." << std::endl;
  }
}